

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

void __thiscall duckdb::QuantileBindData::QuantileBindData(QuantileBindData *this,Value *quantile_p)

{
  bool bVar1;
  pointer puVar2;
  allocator_type local_c9;
  duckdb local_c8 [64];
  QuantileValue local_88;
  
  *(undefined ***)this = &PTR__QuantileBindData_00897fe0;
  QuantileAbs<duckdb::Value>(local_c8,quantile_p);
  QuantileValue::QuantileValue(&local_88,(Value *)local_c8);
  std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::vector
            (&(this->quantiles).
              super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>,1,
             &local_88,&local_c9);
  duckdb::Value::~Value(&local_88.val);
  duckdb::Value::~Value((Value *)local_c8);
  (this->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  puVar2 = (pointer)operator_new(8);
  (this->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar2;
  (this->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar2;
  (this->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar2 + 1;
  *puVar2 = 0;
  (this->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar2 + 1;
  local_88.val = (Value)0x0;
  local_88._1_7_ = 0;
  bVar1 = (bool)duckdb::Value::operator<(quantile_p,(long *)&local_88);
  this->desc = bVar1;
  return;
}

Assistant:

QuantileBindData::QuantileBindData(const Value &quantile_p)
    : quantiles(1, QuantileValue(QuantileAbs(quantile_p))), order(1, 0), desc(quantile_p < 0) {
}